

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O2

Header * __thiscall
wave::HeaderList::header(Header *__return_storage_ptr__,HeaderList *this,string *header_id)

{
  Iterator IVar1;
  __type_conflict _Var2;
  int iVar3;
  string *psVar4;
  Iterator IVar5;
  Iterator iterator;
  Iterator local_60;
  string local_50;
  
  local_60.position_ = 0;
  local_60.stream_ = &this->stream_;
  while( true ) {
    IVar1.position_ = local_60.position_;
    IVar1.stream_ = local_60.stream_;
    IVar5 = end(this);
    if (IVar5 == IVar1) {
      local_50._M_string_length = 0;
      local_50._M_dataplus._M_p = (pointer)this;
      Iterator::operator*(__return_storage_ptr__,(Iterator *)&local_50);
      return __return_storage_ptr__;
    }
    Iterator::operator*(__return_storage_ptr__,&local_60);
    Header::chunk_id_abi_cxx11_(&local_50,__return_storage_ptr__);
    psVar4 = header_id;
    _Var2 = std::operator==(&local_50,header_id);
    iVar3 = (int)psVar4;
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    Iterator::operator++(&local_60,iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::header(const std::string& header_id) {
  for (auto iterator = begin(); iterator != end(); iterator++) {
    auto header = *iterator;
    if (header.chunk_id() == header_id) {
      return header;
    }
  }
  return *begin();
}